

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

bool __thiscall QtMWidgets::PickerPrivate::isRowsVisible(PickerPrivate *this,int start,int end)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  QPersistentModelIndex index;
  QModelIndex local_48;
  
  iVar5 = this->itemsCount;
  pPVar1 = (this->q->d).d;
  pQVar2 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
  iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_48);
  iVar5 = (uint)(this->itemsCount < iVar3) + iVar5;
  QPersistentModelIndex::QPersistentModelIndex
            ((QPersistentModelIndex *)&local_48,&this->topItemIndex);
  if (iVar5 < 1) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    iVar3 = 1;
    do {
      iVar4 = QPersistentModelIndex::row();
      if ((start <= iVar4) && (iVar4 = QPersistentModelIndex::row(), iVar4 <= end)) break;
      makeNextIndex(this,(QPersistentModelIndex *)&local_48);
      bVar6 = iVar3 < iVar5;
      bVar7 = iVar3 != iVar5;
      iVar3 = iVar3 + 1;
    } while (bVar7);
  }
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_48);
  return bVar6;
}

Assistant:

bool
PickerPrivate::isRowsVisible( int start, int end )
{
	int visibleItemsCount = itemsCount;

	if( q->count() > itemsCount )
		++visibleItemsCount;

	QPersistentModelIndex index = topItemIndex;

	for( int i = 0; i < visibleItemsCount; ++i )
	{
		if( index.row() >= start && index.row() <= end )
			return true;

		makeNextIndex( index );
	}

	return false;
}